

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O0

void __thiscall
vkt::BindingModel::anon_unknown_1::BufferComputeInstance::writeDescriptorSet
          (BufferComputeInstance *this,VkDescriptorSet descriptorSet,VkBuffer viewA,deUint32 offsetA
          ,VkBuffer viewB,deUint32 offsetB,VkBuffer resBuf)

{
  ShaderInputInterface SVar1;
  Location local_e8;
  VkDescriptorSet local_e0;
  Location local_d8;
  VkDescriptorSet local_d0;
  Location local_c8;
  VkDescriptorSet local_c0;
  Location local_b8;
  VkDescriptorSet local_b0;
  Location local_a8;
  VkDescriptorSet local_a0;
  deUint64 local_98;
  deUint64 local_90;
  undefined1 local_88 [8];
  VkDescriptorBufferInfo bufferInfos [2];
  undefined1 local_50 [8];
  VkDescriptorBufferInfo resultInfo;
  deUint32 offsetB_local;
  deUint32 offsetA_local;
  BufferComputeInstance *this_local;
  VkBuffer resBuf_local;
  VkBuffer viewB_local;
  VkBuffer viewA_local;
  VkDescriptorSet descriptorSet_local;
  
  bufferInfos[1].range = resBuf.m_internal;
  resultInfo.range._0_4_ = offsetB;
  resultInfo.range._4_4_ = offsetA;
  ::vk::makeDescriptorBufferInfo((VkDescriptorBufferInfo *)local_50,resBuf,0,0x40);
  local_90 = viewA.m_internal;
  ::vk::makeDescriptorBufferInfo
            ((VkDescriptorBufferInfo *)local_88,viewA,(ulong)resultInfo.range._4_4_,0x20);
  local_98 = viewB.m_internal;
  ::vk::makeDescriptorBufferInfo
            ((VkDescriptorBufferInfo *)&bufferInfos[0].range,viewB,(ulong)(deUint32)resultInfo.range
             ,0x20);
  local_a0.m_internal = descriptorSet.m_internal;
  local_a8 = ::vk::DescriptorSetUpdateBuilder::Location::binding(0);
  ::vk::DescriptorSetUpdateBuilder::writeSingle
            (&this->m_updateBuilder,local_a0,&local_a8,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,
             (VkDescriptorBufferInfo *)local_50);
  SVar1 = this->m_shaderInterface;
  if (SVar1 == SHADER_INPUT_SINGLE_DESCRIPTOR) {
    local_b0.m_internal = descriptorSet.m_internal;
    local_b8 = ::vk::DescriptorSetUpdateBuilder::Location::binding(1);
    ::vk::DescriptorSetUpdateBuilder::writeSingle
              (&this->m_updateBuilder,local_b0,&local_b8,this->m_descriptorType,
               (VkDescriptorBufferInfo *)local_88);
  }
  else if (SVar1 == SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS) {
    local_c0.m_internal = descriptorSet.m_internal;
    local_c8 = ::vk::DescriptorSetUpdateBuilder::Location::binding(1);
    ::vk::DescriptorSetUpdateBuilder::writeSingle
              (&this->m_updateBuilder,local_c0,&local_c8,this->m_descriptorType,
               (VkDescriptorBufferInfo *)local_88);
    local_d0.m_internal = descriptorSet.m_internal;
    local_d8 = ::vk::DescriptorSetUpdateBuilder::Location::binding(2);
    ::vk::DescriptorSetUpdateBuilder::writeSingle
              (&this->m_updateBuilder,local_d0,&local_d8,this->m_descriptorType,
               (VkDescriptorBufferInfo *)&bufferInfos[0].range);
  }
  else if (SVar1 == SHADER_INPUT_DESCRIPTOR_ARRAY) {
    local_e0.m_internal = descriptorSet.m_internal;
    local_e8 = ::vk::DescriptorSetUpdateBuilder::Location::binding(1);
    ::vk::DescriptorSetUpdateBuilder::writeArray
              (&this->m_updateBuilder,local_e0,&local_e8,this->m_descriptorType,2,
               (VkDescriptorBufferInfo *)local_88);
  }
  if (this->m_updateMethod == DESCRIPTOR_UPDATE_METHOD_NORMAL) {
    ::vk::DescriptorSetUpdateBuilder::update(&this->m_updateBuilder,this->m_vki,this->m_device);
  }
  return;
}

Assistant:

void BufferComputeInstance::writeDescriptorSet (vk::VkDescriptorSet descriptorSet, vk::VkBuffer viewA, deUint32 offsetA, vk::VkBuffer viewB, deUint32 offsetB, vk::VkBuffer resBuf)
{
	const vk::VkDescriptorBufferInfo		resultInfo		= vk::makeDescriptorBufferInfo(resBuf, 0u, (vk::VkDeviceSize)ComputeInstanceResultBuffer::DATA_SIZE);
	const vk::VkDescriptorBufferInfo		bufferInfos[2]	=
	{
		vk::makeDescriptorBufferInfo(viewA, (vk::VkDeviceSize)offsetA, (vk::VkDeviceSize)sizeof(tcu::Vec4[2])),
		vk::makeDescriptorBufferInfo(viewB, (vk::VkDeviceSize)offsetB, (vk::VkDeviceSize)sizeof(tcu::Vec4[2])),
	};

	// result
	m_updateBuilder.writeSingle(descriptorSet, vk::DescriptorSetUpdateBuilder::Location::binding(0u), vk::VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &resultInfo);

	// buffers
	switch (m_shaderInterface)
	{
		case SHADER_INPUT_SINGLE_DESCRIPTOR:
			m_updateBuilder.writeSingle(descriptorSet, vk::DescriptorSetUpdateBuilder::Location::binding(1u), m_descriptorType, &bufferInfos[0]);
			break;

		case SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS:
			m_updateBuilder.writeSingle(descriptorSet, vk::DescriptorSetUpdateBuilder::Location::binding(1u), m_descriptorType, &bufferInfos[0]);
			m_updateBuilder.writeSingle(descriptorSet, vk::DescriptorSetUpdateBuilder::Location::binding(2u), m_descriptorType, &bufferInfos[1]);
			break;

		case SHADER_INPUT_DESCRIPTOR_ARRAY:
			m_updateBuilder.writeArray(descriptorSet, vk::DescriptorSetUpdateBuilder::Location::binding(1u), m_descriptorType, 2u, bufferInfos);
			break;

		default:
			DE_FATAL("Impossible");
	}

	if (m_updateMethod == DESCRIPTOR_UPDATE_METHOD_NORMAL)
	{
		m_updateBuilder.update(m_vki, m_device);
	}
}